

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O3

bool __thiscall HashTbl::Contains(HashTbl *this,LPCOLESTR prgch,int32 cch)

{
  LPCOLESTR __s2;
  OLECHAR OVar1;
  int iVar2;
  uint uVar3;
  Ident *pIVar4;
  
  __s2 = prgch + cch;
  uVar3 = 0;
  if (prgch < __s2) {
    uVar3 = 0;
    do {
      OVar1 = *prgch;
      prgch = prgch + 1;
      uVar3 = (uint)(ushort)OVar1 + uVar3 * 0x11;
    } while (prgch < __s2);
  }
  pIVar4 = this->m_prgpidName[this->m_luMask & uVar3];
  if (pIVar4 != (Ident *)0x0) {
    do {
      if (((pIVar4->m_luHash == uVar3) && (pIVar4->m_cch == cch)) &&
         (iVar2 = bcmp(&pIVar4->field_0x22,__s2,(long)cch * -2), iVar2 == 0)) {
        return true;
      }
      pIVar4 = pIVar4->m_pidNext;
    } while (pIVar4 != (Ident *)0x0);
  }
  return false;
}

Assistant:

bool HashTbl::Contains(_In_reads_(cch) LPCOLESTR prgch, int32 cch)
{
    uint32 luHash = CaseSensitiveComputeHash(prgch, prgch + cch);

    for (auto pid = m_prgpidName[luHash & m_luMask]; pid; pid = pid->m_pidNext)
    {
        if (pid->m_luHash == luHash && (int)pid->m_cch == cch &&
            HashTbl::CharsAreEqual(pid->m_sz, prgch + cch, prgch))
        {
            return true;
        }
    }

    return false;
}